

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

void __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::dump(iterator *this,ostream *os)

{
  ostream *poVar1;
  __extent_storage<18446744073709551615UL> in_RCX;
  __extent_storage<18446744073709551615UL> _Var2;
  _Map_pointer ppiVar3;
  span<const_std::byte,_18446744073709551615UL> key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  undefined1 local_80 [8];
  stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
  tmp;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::operator<<(os,"iter::stack:: empty\n");
    return;
  }
  std::operator<<(os,"keybuf=");
  key._M_extent._M_extent_value = in_RCX._M_extent_value;
  key._M_ptr = (pointer)(this->keybuf_).off;
  detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
            ((detail *)os,(ostream *)(this->keybuf_).buf,key);
  std::operator<<(os,"\n");
  std::
  deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::deque((deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
           *)local_80,&(this->stack_).c);
  std::
  deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::size((deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
          *)local_80);
  while (tmp.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         tmp.c.
         super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size) {
    ppiVar3 = tmp.c.
              super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    if ((_Elt_pointer)
        tmp.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
        tmp.c.
        super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      ppiVar3 = (_Map_pointer)
                (tmp.c.
                 super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].prefix.u64 + 0x1f8);
    }
    poVar1 = std::operator<<(os,"iter::stack:: level = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", key_byte=0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = std::operator<<(poVar1,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = std::operator<<(poVar1,", child_index=0x");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = std::operator<<(poVar1,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    _Var2._M_extent_value = *(size_t *)(*(long *)poVar1 + -0x18);
    *(uint *)(poVar1 + _Var2._M_extent_value + 0x18) =
         *(uint *)(poVar1 + _Var2._M_extent_value + 0x18) & 0xffffffb5 | 2;
    poVar1 = std::operator<<(poVar1,", prefix(");
    poVar1 = std::operator<<(poVar1,*(char *)((long)ppiVar3 + -1));
    std::operator<<(poVar1,")=");
    key_00._M_ptr = (pointer)(ulong)*(byte *)((long)ppiVar3 + -1);
    key_00._M_extent._M_extent_value = _Var2._M_extent_value;
    detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)os,(ostream *)(ppiVar3 + -1),key_00);
    std::operator<<(os,", ");
    detail::
    basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
    ::dump_node(os,(basic_node_ptr<unodb::detail::node_header> *)(ppiVar3 + -3),false);
    if ((((basic_node_ptr<unodb::detail::node_header> *)(ppiVar3 + -3))->tagged_ptr & 7) != 0) {
      std::operator<<(os,'\n');
    }
    std::
    deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
    ::pop_back((deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                *)local_80);
  }
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                  *)local_80);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream& os) const {
      if (empty()) {
        os << "iter::stack:: empty\n";
        return;
      }
      // Dump the key buffer maintained by the iterator.
      os << "keybuf=";
      detail::dump_key(os, keybuf_.get_key_view());
      os << "\n";
      // Create a new stack and copy everything there.  Using the new
      // stack, print out the stack in top-bottom order.  This avoids
      // modifications to the existing stack for the iterator.
      auto tmp = stack_;
      auto level = tmp.size() - 1;
      while (!tmp.empty()) {
        const auto& e = tmp.top();
        const auto& np = e.node;
        os << "iter::stack:: level = " << level << ", key_byte=0x" << std::hex
           << std::setfill('0') << std::setw(2)
           << static_cast<std::uint64_t>(e.key_byte) << std::dec
           << ", child_index=0x" << std::hex << std::setfill('0')
           << std::setw(2) << static_cast<std::uint64_t>(e.child_index)
           << std::dec << ", prefix(" << e.prefix.length() << ")=";
        detail::dump_key(os, e.prefix.get_key_view());
        os << ", ";
        art_policy::dump_node(os, np, false /*recursive*/);
        if (np.type() != node_type::LEAF) os << '\n';
        tmp.pop();
        level--;
      }
    }